

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::ProcessMorphAnimDatas
          (FBXConverter *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
          *morphAnimDatas,BlendShapeChannel *bsc,AnimationCurveNode *node)

{
  char *pcVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  iterator __position;
  bool bVar4;
  _Alloc_hider _Var5;
  uint uVar6;
  int iVar7;
  Object *pOVar8;
  long lVar9;
  __normal_iterator<const_Assimp::FBX::BlendShapeChannel_*const_*,_std::vector<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>_>
  _Var10;
  pointer ppCVar11;
  __normal_iterator<const_Assimp::FBX::Geometry_*const_*,_std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>_>
  _Var12;
  iterator iVar13;
  _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
  *p_Var14;
  AnimationCurveMap *pAVar15;
  _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
  *p_Var16;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  _Base_ptr p_Var17;
  undefined8 uVar18;
  _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
  *p_Var19;
  uint uVar20;
  char *pcVar21;
  bool bVar22;
  ulong uVar23;
  size_t sVar24;
  long *plVar25;
  ulong uVar26;
  _Rb_tree_header *p_Var27;
  uint channelIndex;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>
  curvesIt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  geoConnections;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  bsConnections;
  Geometry *geo;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  bscConnections;
  aiString name;
  uint local_54c;
  string local_548;
  long local_528;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>>
  *local_520;
  _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
  *local_518;
  string local_510;
  FBXConverter *local_4f0;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_4e8;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_4d0;
  pointer local_4b8;
  pointer local_4b0;
  pointer local_4a8;
  pointer local_4a0;
  _Base_ptr local_498;
  AnimationCurveNode *local_490;
  pointer local_488;
  pointer local_480;
  _Base_ptr local_478;
  _Base_ptr local_470;
  long *local_468;
  long local_460;
  BlendShapeChannel *local_458;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  local_450;
  uint local_434;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430 [64];
  
  local_520 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>>
               *)morphAnimDatas;
  local_4f0 = this;
  local_490 = node;
  local_458 = bsc;
  Document::GetConnectionsBySourceSequenced
            (&local_450,this->doc,(bsc->super_Deformer).super_Object.id,"Deformer");
  local_4b8 = local_450.
              super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_450.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_450.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_498 = (_Base_ptr)(local_520 + 8);
    ppCVar11 = local_450.
               super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      pOVar8 = Connection::DestinationObject(*ppCVar11);
      local_4b0 = ppCVar11;
      if (pOVar8 == (Object *)0x0) {
        lVar9 = 0;
      }
      else {
        lVar9 = __dynamic_cast(pOVar8,&Object::typeinfo,&BlendShape::typeinfo,0);
      }
      if ((lVar9 != 0) &&
         (_Var10 = std::
                   __find_if<__gnu_cxx::__normal_iterator<Assimp::FBX::BlendShapeChannel_const*const*,std::vector<Assimp::FBX::BlendShapeChannel_const*,std::allocator<Assimp::FBX::BlendShapeChannel_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::FBX::BlendShapeChannel_const*const>>
                             (*(undefined8 *)(lVar9 + 0x48),*(undefined8 *)(lVar9 + 0x50),&local_458
                             ), _Var10._M_current != *(BlendShapeChannel ***)(lVar9 + 0x50))) {
        local_54c = (uint)((ulong)((long)_Var10._M_current - *(long *)(lVar9 + 0x48)) >> 3);
        Document::GetConnectionsBySourceSequenced
                  (&local_4d0,local_4f0->doc,*(uint64_t *)(lVar9 + 0x30),"Geometry");
        local_4a8 = local_4d0.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        ppCVar11 = local_4d0.
                   super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (local_4d0.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_4d0.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            local_4a0 = ppCVar11;
            pOVar8 = Connection::DestinationObject(*ppCVar11);
            if (pOVar8 == (Object *)0x0) {
              local_460 = 0;
            }
            else {
              local_460 = __dynamic_cast(pOVar8,&Object::typeinfo,&Geometry::typeinfo,0);
            }
            if (local_460 != 0) {
              Document::GetConnectionsBySourceSequenced
                        (&local_4e8,local_4f0->doc,*(uint64_t *)(local_460 + 0x30),"Model");
              local_488 = local_4e8.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              ppCVar11 = local_4e8.
                         super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              if (local_4e8.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_4e8.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                do {
                  pOVar8 = Connection::DestinationObject(*ppCVar11);
                  local_480 = ppCVar11;
                  if (pOVar8 == (Object *)0x0) {
                    lVar9 = 0;
                  }
                  else {
                    lVar9 = __dynamic_cast(pOVar8,&Object::typeinfo,&Model::typeinfo,0);
                  }
                  if (lVar9 != 0) {
                    _Var12 = std::
                             __find_if<__gnu_cxx::__normal_iterator<Assimp::FBX::Geometry_const*const*,std::vector<Assimp::FBX::Geometry_const*,std::allocator<Assimp::FBX::Geometry_const*>>>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::FBX::Geometry_const*const>>
                                       (*(undefined8 *)(lVar9 + 0x50),*(undefined8 *)(lVar9 + 0x58),
                                        &local_460);
                    lVar2 = *(long *)(lVar9 + 0x50);
                    local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_510,*(long *)(lVar9 + 0x10),
                               *(long *)(lVar9 + 0x18) + *(long *)(lVar9 + 0x10));
                    pcVar21 = "*";
                    std::__cxx11::string::append((char *)&local_510);
                    FixNodeName(&local_548,(FBXConverter *)pcVar21,&local_510);
                    _Var5._M_p = local_548._M_dataplus._M_p;
                    sVar24 = local_548._M_string_length & 0xffffffff;
                    if ((local_548._M_string_length & 0xfffffc00) != 0) {
                      sVar24 = 0x3ff;
                    }
                    local_434 = (uint)sVar24;
                    memcpy(local_430,local_548._M_dataplus._M_p,sVar24);
                    local_430[0]._M_local_buf[sVar24] = '\0';
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var5._M_p != &local_548.field_2) {
                      operator_delete(_Var5._M_p,local_548.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_510._M_dataplus._M_p != &local_510.field_2) {
                      operator_delete(local_510._M_dataplus._M_p,
                                      local_510.field_2._M_allocated_capacity + 1);
                    }
                    uVar26 = (ulong)((long)_Var12._M_current - lVar2) >> 3;
                    uVar23 = (ulong)local_434;
                    pcVar21 = local_430[0]._M_local_buf + uVar23;
                    local_434 = 1;
                    if ((int)uVar26 < 0) {
                      *pcVar21 = '-';
                      pcVar21 = local_430[0]._M_local_buf + uVar23 + 1;
                      uVar26 = (ulong)(uint)-(int)uVar26;
                      local_434 = 2;
                    }
                    iVar7 = 1000000000;
                    bVar22 = false;
                    do {
                      if (0x3fe < local_434) break;
                      uVar23 = (ulong)(uint)((int)(uint)uVar26 >> 0x1f) << 0x20 |
                               uVar26 & 0xffffffff;
                      lVar9 = (long)uVar23 / (long)iVar7;
                      uVar20 = (uint)((long)uVar23 % (long)iVar7);
                      if (((bVar22) || (iVar7 == 1)) || (uVar6 = (uint)uVar26, (int)lVar9 != 0)) {
                        pcVar1 = pcVar21 + 1;
                        local_434 = local_434 + 1;
                        *pcVar21 = (char)lVar9 + '0';
                        bVar22 = true;
                        pcVar21 = pcVar1;
                        uVar6 = uVar20;
                        if (iVar7 != 1) goto LAB_005d3ac2;
                        bVar4 = false;
                        iVar7 = 1;
                      }
                      else {
LAB_005d3ac2:
                        uVar20 = uVar6;
                        iVar7 = iVar7 / 10;
                        bVar4 = true;
                      }
                      uVar26 = (ulong)uVar20;
                    } while (bVar4);
                    *pcVar21 = '\0';
                    local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
                    sVar24 = strlen(local_430[0]._M_local_buf);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_548,local_430,local_430[0]._M_local_buf + sVar24);
                    iVar13 = std::
                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>_>_>
                                     *)local_520,&local_548);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_548._M_dataplus._M_p != &local_548.field_2) {
                      operator_delete(local_548._M_dataplus._M_p,
                                      local_548.field_2._M_allocated_capacity + 1);
                    }
                    if (iVar13._M_node == local_498) {
                      p_Var14 = (_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                 *)operator_new(0x30);
                      *(undefined8 *)(p_Var14 + 0x10) = 0;
                      *(undefined8 *)(p_Var14 + 0x18) = 0;
                      *(undefined8 *)(p_Var14 + 0x20) = 0;
                      *(undefined8 *)(p_Var14 + 0x28) = 0;
                      *(undefined8 *)p_Var14 = 0;
                      *(undefined8 *)(p_Var14 + 8) = 0;
                      *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                        **)(p_Var14 + 0x18) = p_Var14 + 8;
                      *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                        **)(p_Var14 + 0x20) = p_Var14 + 8;
                      *(undefined8 *)(p_Var14 + 0x28) = 0;
                      local_548._M_dataplus._M_p = (pointer)local_430;
                      local_548._M_string_length = (size_type)p_Var14;
                      std::
                      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>>
                      ::
                      _M_emplace_unique<std::pair<char_const*,std::map<long,morphKeyData*,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>*>>
                                (local_520,
                                 (pair<const_char_*,_std::map<long,_morphKeyData_*,_std::less<long>,_std::allocator<std::pair<const_long,_morphKeyData_*>_>_>_*>
                                  *)&local_548);
                    }
                    else {
                      p_Var14 = *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                  **)(iVar13._M_node + 2);
                    }
                    pAVar15 = AnimationCurveNode::Curves_abi_cxx11_(local_490);
                    p_Var17 = (pAVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                    p_Var27 = &(pAVar15->_M_t)._M_impl.super__Rb_tree_header;
                    local_518 = p_Var14;
                    if ((_Rb_tree_header *)p_Var17 != p_Var27) {
                      p_Var14 = p_Var14 + 8;
                      local_478 = &p_Var27->_M_header;
                      do {
                        local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_548,*(long *)(p_Var17 + 1),
                                   (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1))
                        ;
                        local_528 = *(long *)(p_Var17 + 2);
                        local_470 = p_Var17;
                        iVar7 = std::__cxx11::string::compare((char *)&local_548);
                        lVar9 = local_528;
                        if (iVar7 == 0) {
                          plVar25 = *(long **)(local_528 + 0x38);
                          local_468 = *(long **)(local_528 + 0x40);
                          if (plVar25 != local_468) {
                            uVar23 = 0;
                            do {
                              paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                        *)*plVar25;
                              p_Var16 = p_Var14;
                              for (p_Var19 = *(_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                               **)(local_518 + 0x10);
                                  p_Var19 !=
                                  (_Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                   *)0x0; p_Var19 = *(
                                                  _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                                  **)(p_Var19 +
                                                     (ulong)(*(long *)(p_Var19 + 0x20) <
                                                            (long)paVar3) * 8 + 0x10)) {
                                if ((long)paVar3 <= *(long *)(p_Var19 + 0x20)) {
                                  p_Var16 = p_Var19;
                                }
                              }
                              p_Var19 = p_Var14;
                              if ((p_Var16 != p_Var14) &&
                                 (p_Var19 = p_Var16, (long)paVar3 < *(long *)(p_Var16 + 0x20))) {
                                p_Var19 = p_Var14;
                              }
                              if (p_Var19 == p_Var14) {
                                this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                                          operator_new(0x30);
                                *(undefined8 *)(this_00 + 0x20) = 0;
                                *(undefined8 *)(this_00 + 0x28) = 0;
                                *(undefined8 *)(this_00 + 0x10) = 0;
                                *(undefined8 *)(this_00 + 0x18) = 0;
                                *(undefined8 *)&this_00->field_0x0 = 0;
                                *(undefined8 *)(this_00 + 8) = 0;
                                local_510._M_dataplus._M_p = (pointer)paVar3;
                                local_510._M_string_length = (size_type)this_00;
                                std::
                                _Rb_tree<long,std::pair<long_const,morphKeyData*>,std::_Select1st<std::pair<long_const,morphKeyData*>>,std::less<long>,std::allocator<std::pair<long_const,morphKeyData*>>>
                                ::_M_emplace_unique<std::pair<long,morphKeyData*>>
                                          (local_518,(pair<long,_morphKeyData_*> *)&local_510);
                              }
                              else {
                                this_00 = *(vector<unsigned_int,std::allocator<unsigned_int>> **)
                                           (p_Var19 + 0x28);
                              }
                              __position._M_current = *(uint **)(this_00 + 8);
                              if (__position._M_current == *(uint **)(this_00 + 0x10)) {
                                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                                _M_realloc_insert<unsigned_int_const&>
                                          (this_00,__position,&local_54c);
                              }
                              else {
                                *__position._M_current = local_54c;
                                *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 4;
                              }
                              lVar2 = *(long *)(lVar9 + 0x50);
                              if ((ulong)(*(long *)(lVar9 + 0x58) - lVar2 >> 2) <= uVar23) {
                                uVar18 = std::__throw_out_of_range_fmt
                                                   (
                                                  "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                                  );
                                if (local_450.
                                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                  operator_delete(local_450.
                                                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_450.
                                                                                                                
                                                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_450.
                                                                                                                    
                                                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                }
                                _Unwind_Resume(uVar18);
                              }
                              local_510._M_dataplus._M_p._0_4_ =
                                   *(float *)(lVar2 + uVar23 * 4) / 100.0;
                              std::vector<float,_std::allocator<float>_>::emplace_back<float>
                                        ((vector<float,_std::allocator<float>_> *)(this_00 + 0x18),
                                         (float *)&local_510);
                              uVar23 = (ulong)((int)uVar23 + 1);
                              plVar25 = plVar25 + 1;
                            } while (plVar25 != local_468);
                          }
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_548._M_dataplus._M_p != &local_548.field_2) {
                          operator_delete(local_548._M_dataplus._M_p,
                                          local_548.field_2._M_allocated_capacity + 1);
                        }
                        p_Var17 = (_Base_ptr)std::_Rb_tree_increment(local_470);
                      } while (p_Var17 != local_478);
                    }
                  }
                  ppCVar11 = local_480 + 1;
                } while (ppCVar11 != local_488);
              }
              if (local_4e8.
                  super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_4e8.
                                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_4e8.
                                      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_4e8.
                                      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            ppCVar11 = local_4a0 + 1;
          } while (ppCVar11 != local_4a8);
        }
        if (local_4d0.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_4d0.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_4d0.
                                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_4d0.
                                super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      ppCVar11 = local_4b0 + 1;
    } while (ppCVar11 != local_4b8);
  }
  if (local_450.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_450.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_450.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_450.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FBXConverter::ProcessMorphAnimDatas(std::map<std::string, morphAnimData*>* morphAnimDatas, const BlendShapeChannel* bsc, const AnimationCurveNode* node) {
            std::vector<const Connection*> bscConnections = doc.GetConnectionsBySourceSequenced(bsc->ID(), "Deformer");
            for (const Connection* bscConnection : bscConnections) {
                auto bs = dynamic_cast<const BlendShape*>(bscConnection->DestinationObject());
                if (bs) {
                    auto channelIt = std::find(bs->BlendShapeChannels().begin(), bs->BlendShapeChannels().end(), bsc);
                    if (channelIt != bs->BlendShapeChannels().end()) {
                        auto channelIndex = static_cast<unsigned int>(std::distance(bs->BlendShapeChannels().begin(), channelIt));
                        std::vector<const Connection*> bsConnections = doc.GetConnectionsBySourceSequenced(bs->ID(), "Geometry");
                        for (const Connection* bsConnection : bsConnections) {
                            auto geo = dynamic_cast<const Geometry*>(bsConnection->DestinationObject());
                            if (geo) {
                                std::vector<const Connection*> geoConnections = doc.GetConnectionsBySourceSequenced(geo->ID(), "Model");
                                for (const Connection* geoConnection : geoConnections) {
                                    auto model = dynamic_cast<const Model*>(geoConnection->DestinationObject());
                                    if (model) {
                                        auto geoIt = std::find(model->GetGeometry().begin(), model->GetGeometry().end(), geo);
                                        auto geoIndex = static_cast<unsigned int>(std::distance(model->GetGeometry().begin(), geoIt));
                                        auto name = aiString(FixNodeName(model->Name() + "*"));
                                        name.length = 1 + ASSIMP_itoa10(name.data + name.length, MAXLEN - 1, geoIndex);
                                        morphAnimData* animData;
                                        auto animIt = morphAnimDatas->find(name.C_Str());
                                        if (animIt == morphAnimDatas->end()) {
                                            animData = new morphAnimData();
                                            morphAnimDatas->insert(std::make_pair(name.C_Str(), animData));
                                        }
                                        else {
                                            animData = animIt->second;
                                        }
                                        for (std::pair<std::string, const AnimationCurve*> curvesIt : node->Curves()) {
                                            if (curvesIt.first == "d|DeformPercent") {
                                                const AnimationCurve* animationCurve = curvesIt.second;
                                                const KeyTimeList& keys = animationCurve->GetKeys();
                                                const KeyValueList& values = animationCurve->GetValues();
                                                unsigned int k = 0;
                                                for (auto key : keys) {
                                                    morphKeyData* keyData;
                                                    auto keyIt = animData->find(key);
                                                    if (keyIt == animData->end()) {
                                                        keyData = new morphKeyData();
                                                        animData->insert(std::make_pair(key, keyData));
                                                    }
                                                    else {
                                                        keyData = keyIt->second;
                                                    }
                                                    keyData->values.push_back(channelIndex);
                                                    keyData->weights.push_back(values.at(k) / 100.0f);
                                                    k++;
                                                }
                                            }
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }